

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  vec_3d vVar6;
  euler eVar7;
  quaternion qVar8;
  vec_3d b;
  vec_3d a;
  quaternion q2;
  quaternion q1;
  quaternion quat;
  anon_union_4_2_313de162_for_euler__0 local_c8;
  anon_union_4_2_3dd69ce4_for_euler__2 aStack_c4;
  anon_union_4_2_0ec104fb_for_quaternion__0 local_b8;
  float fStack_b4;
  vec_3d local_a8;
  vec_3d local_98;
  quaternion local_88;
  quaternion local_78;
  euler local_68;
  vec_3d local_58;
  quaternion local_48;
  
  local_98.x = 1.0;
  local_98.y = 2.0;
  local_98.z = 3.0;
  local_a8.x = 1.0;
  local_a8.y = 1.0;
  local_a8.z = 1.0;
  pcVar1 = print_vector(&local_98,"a");
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106038);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  pcVar1 = print_vector(&local_a8,"b");
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106038);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  fVar4 = operator~(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|a| =",5);
  poVar3 = std::ostream::_M_insert<double>((double)fVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  fVar4 = operator~(&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|b| =",5);
  poVar3 = std::ostream::_M_insert<double>((double)fVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  fVar4 = operator*(&local_98,&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dot product: ",0xd);
  poVar3 = std::ostream::_M_insert<double>((double)fVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  vVar6 = operator^(&local_98,&local_a8);
  local_58.z = vVar6.z;
  local_58._0_8_ = vVar6._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Vector product ",0xf);
  pcVar1 = print_vector(&local_58,"c");
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106038);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  local_48._0_8_ = 0x3f3504813f350481;
  local_48.field_1._4_8_ = 0;
  eVar7 = euler_from_quat(&local_48);
  local_68._0_8_ = eVar7._0_8_;
  local_68.field_2 = eVar7.field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Euler: ",7);
  aStack_c4 = eVar7.field_1;
  poVar3 = std::ostream::_M_insert<double>((double)aStack_c4.pitch);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  local_c8 = eVar7.field_0;
  poVar3 = std::ostream::_M_insert<double>((double)local_c8.roll);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>((double)eVar7.field_2.yaw);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  qVar8 = quat_from_euler(&local_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quaternion: ",0xc);
  local_b8 = qVar8.field_0;
  poVar3 = std::ostream::_M_insert<double>((double)local_b8.w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  fStack_b4 = qVar8.field_1._0_4_;
  poVar3 = std::ostream::_M_insert<double>((double)fStack_b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  local_c8 = qVar8.field_1._4_4_;
  poVar3 = std::ostream::_M_insert<double>((double)(float)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  aStack_c4 = qVar8.field_1._8_4_;
  poVar3 = std::ostream::_M_insert<double>((double)(float)aStack_c4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_78._0_8_ = 0xbf8000003f800000;
  local_78.field_1._4_8_ = 0x3f800000bf800000;
  local_88._0_8_ = 0xbf800000bf800000;
  local_88.field_1._4_8_ = 0xbf800000bf800000;
  qVar8 = quaternion_multiply(&local_78,&local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quaternion: ",0xc);
  local_b8 = qVar8.field_0;
  poVar3 = std::ostream::_M_insert<double>((double)local_b8.w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  fStack_b4 = qVar8.field_1._0_4_;
  poVar3 = std::ostream::_M_insert<double>((double)fStack_b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  local_c8 = qVar8.field_1._4_4_;
  poVar3 = std::ostream::_M_insert<double>((double)(float)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  aStack_c4 = qVar8.field_1._8_4_;
  poVar3 = std::ostream::_M_insert<double>((double)(float)aStack_c4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  fVar4 = local_78.field_0.w * local_88.field_0.w;
  fVar5 = operator*(&local_78.field_1.dual,&local_88.field_1.dual);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quaternion: ",0xc);
  poVar3 = std::ostream::_M_insert<double>((double)(fVar4 - fVar5));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return 0;
}

Assistant:

auto main() -> int {
    vec_3d a = {1.f, 2.f, 3.f};
    vec_3d b = {1.f, 1.f, 1.f};
    vec_3d c = {0.f};
    float d = 0.f;

    std::cout << print_vector(&a, "a");
    std::cout << print_vector(&b, "b");

    d = ~a;
    std::cout << "|a| =" << d << "\n";
    d = ~b;
    std::cout << "|b| =" << d << "\n";

    d = a * b;
    std::cout << "Dot product: " << d << "\n";

    c = a ^ b;
    std::cout << "Vector product ";
    std::cout << print_vector(&c, "c");

    quaternion quat = {0.7071f, 0.7071f, 0.f, 0.f};
    euler eul = {0.f};
    eul = euler_from_quat(&quat);
    std::cout << "Euler: " << eul.pitch << ", " << eul.roll << ", " << eul.yaw
              << "\n";

    quaternion test_quat;
    test_quat = quat_from_euler(&eul);
    std::cout << "Quaternion: " << test_quat.w << ", " << test_quat.dual.x
              << ", " << test_quat.dual.y << ", " << test_quat.dual.z << "\n";

    assert(fabsf(test_quat.q0 - quat.q0) < 0.1f);
    assert(fabsf(test_quat.q1 - quat.q1) < 0.1f);
    assert(fabsf(test_quat.q2 - quat.q2) < 0.1f);
    assert(fabsf(test_quat.q3 - quat.q3) < 0.1f);

    quaternion q1 = {1.f, -1.f, -1.f, 1.f};
    quaternion q2 = {-1.f, -1.f, -1.f, -1.f};
    quaternion q3 = quaternion_multiply(&q1, &q2);
    std::cout << "Quaternion: " << q3.q0 << ", " << q3.q1 << ", " << q3.q2
              << ", " << q3.q3 << "\n";

    quaternion q4;
    q4.w = q1.q0 * q2.q0 - (q1.dual * q2.dual);

    std::cout << "Quaternion: " << q4.q0 << ", " << q4.q1 << ", " << q4.q2
              << ", " << q4.q3 << "\n";

    return 0;
}